

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O2

void data_sheet_expat_callback_find_cell_start(void *callbackdata,XML_Char *name,XML_Char **atts)

{
  uint uVar1;
  ulong uVar2;
  undefined4 uVar3;
  int iVar4;
  XML_Char *pXVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  size_t cellmax;
  ulong uVar10;
  
  iVar4 = XML_Char_icmp_ins(name,"c");
  if (iVar4 != 0) {
    return;
  }
  pXVar5 = get_expat_attr_by_name(atts,"r");
  sVar6 = get_col_nr(pXVar5);
  uVar9 = *(ulong *)((long)callbackdata + 0x18);
  if (uVar9 == 0) {
    sVar7 = get_row_nr(pXVar5);
    if (sVar7 != 0) {
      if ((*(byte *)((long)callbackdata + 0x44) & 0x81) == 0) {
        uVar10 = *(ulong *)((long)callbackdata + 0x10);
        uVar9 = 0;
        while (uVar10 < sVar7) {
          if (((*(byte *)((long)callbackdata + 0x44) & 2) == 0) &&
             (*(long *)((long)callbackdata + 0x78) != 0)) {
            uVar10 = 0;
            while (uVar10 < *(ulong *)((long)callbackdata + 0x20)) {
              iVar4 = (**(code **)((long)callbackdata + 0x78))
                                (*(undefined8 *)((long)callbackdata + 0x10),uVar10 + 1,0,
                                 *(undefined8 *)((long)callbackdata + 0x80));
              if (iVar4 != 0) goto LAB_00104723;
              uVar10 = *(long *)((long)callbackdata + 0x18) + 1;
              *(ulong *)((long)callbackdata + 0x18) = uVar10;
            }
            uVar10 = *(ulong *)((long)callbackdata + 0x10);
          }
          if (*(code **)((long)callbackdata + 0x70) != (code *)0x0) {
            iVar4 = (**(code **)((long)callbackdata + 0x70))
                              (uVar10,*(undefined8 *)((long)callbackdata + 0x20),
                               *(undefined8 *)((long)callbackdata + 0x80));
            if (iVar4 != 0) goto LAB_00104723;
            uVar10 = *(ulong *)((long)callbackdata + 0x10);
          }
          uVar10 = uVar10 + 1;
          *(ulong *)((long)callbackdata + 0x10) = uVar10;
          *(undefined8 *)((long)callbackdata + 0x18) = 0;
        }
        goto LAB_001045cb;
      }
      *(size_t *)((long)callbackdata + 0x10) = sVar7;
    }
    uVar9 = 0;
  }
LAB_001045cb:
  if (sVar6 != 0) {
    uVar10 = sVar6 - 1;
    uVar1 = *(uint *)((long)callbackdata + 0x44);
    if (((uVar1 & 2) == 0) && (-1 < (char)uVar1 && uVar9 != 0)) {
      if ((uVar1 & 4) != 0) {
        uVar2 = *(ulong *)((long)callbackdata + 0x20);
        uVar8 = uVar2;
        if (uVar10 < uVar2) {
          uVar8 = uVar10;
        }
        if (uVar2 != 0) {
          uVar10 = uVar8;
        }
      }
      while (uVar9 < uVar10) {
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else if (*(code **)((long)callbackdata + 0x78) != (code *)0x0) {
          iVar4 = (**(code **)((long)callbackdata + 0x78))
                            (*(undefined8 *)((long)callbackdata + 0x10),uVar9 + 1,0,
                             *(undefined8 *)((long)callbackdata + 0x80));
          if (iVar4 != 0) {
LAB_00104723:
            XML_StopParser(*callbackdata,0);
            return;
          }
          uVar9 = *(ulong *)((long)callbackdata + 0x18);
        }
        uVar9 = uVar9 + 1;
        *(ulong *)((long)callbackdata + 0x18) = uVar9;
      }
    }
    else {
      *(ulong *)((long)callbackdata + 0x18) = uVar10;
    }
  }
  pXVar5 = get_expat_attr_by_name(atts,"t");
  if ((pXVar5 == (XML_Char *)0x0) || (iVar4 = strcasecmp(pXVar5,"s"), iVar4 != 0)) {
    uVar3 = 1;
  }
  else {
    uVar3 = 3;
  }
  *(undefined4 *)((long)callbackdata + 0x40) = uVar3;
  free(*(void **)((long)callbackdata + 0x30));
  *(undefined8 *)((long)callbackdata + 0x30) = 0;
  *(undefined8 *)((long)callbackdata + 0x38) = 0;
  XML_SetElementHandler
            (*callbackdata,data_sheet_expat_callback_find_value_start,
             data_sheet_expat_callback_find_cell_end);
  return;
}

Assistant:

void data_sheet_expat_callback_find_cell_start (void* callbackdata, const XML_Char* name, const XML_Char** atts)
{
  struct data_sheet_callback_data* data = (struct data_sheet_callback_data*)callbackdata;
  if (XML_Char_icmp_ins(name, X("c")) == 0) {
    const XML_Char* t = get_expat_attr_by_name(atts, X("r"));
    size_t cellcolnr = get_col_nr(t);
    //insert empty rows if needed
    if (data->colnr == 0) {
      size_t cellrownr = get_row_nr(t);
      if (cellrownr) {
        if (!(data->flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && !(data->flags & XLSXIOREAD_NO_CALLBACK)) {
          while (data->rownr < cellrownr) {
            //insert empty columns
            if (!(data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && data->sheet_cell_callback) {
              while (data->colnr < data->cols) {
                if ((*data->sheet_cell_callback)(data->rownr, data->colnr + 1, NULL, data->callbackdata)) {
                  XML_StopParser(data->xmlparser, XML_FALSE);
                  return;
                }
                data->colnr++;
              }
            }
            //finish empty row
            if (data->sheet_row_callback) {
              if ((*data->sheet_row_callback)(data->rownr, data->cols, data->callbackdata)) {
                XML_StopParser(data->xmlparser, XML_FALSE);
                return;
              }
            }
            data->rownr++;
            data->colnr = 0;
          }
        } else {
          data->rownr = cellrownr;
        }
      }
    }
    //insert empty columns if needed
    if (cellcolnr) {
      cellcolnr--;
      if ((data->flags & XLSXIOREAD_SKIP_EMPTY_CELLS) || data->colnr == 0 || (data->flags & XLSXIOREAD_NO_CALLBACK)) {
        data->colnr = cellcolnr;
      } else {
        size_t cellmax = cellcolnr;
        if ((data->flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && data->cols > 0 && cellmax > data->cols)
          cellmax = data->cols;
        while (data->colnr < cellmax) {
          if (data->colnr > 0 && data->sheet_cell_callback) {
            if ((*data->sheet_cell_callback)(data->rownr, data->colnr + 1, NULL, data->callbackdata)) {
              XML_StopParser(data->xmlparser, XML_FALSE);
              return;
            }
          }
          data->colnr++;
        }
      }
    }
    //determine value type
    if ((t = get_expat_attr_by_name(atts, X("t"))) != NULL && XML_Char_icmp(t, X("s")) == 0)
      data->cell_string_type = shared_string;
    else
      data->cell_string_type = value_string;
    //prepare empty value data
    free(data->celldata);
    data->celldata = NULL;
    data->celldatalen = 0;
    XML_SetElementHandler(data->xmlparser, data_sheet_expat_callback_find_value_start, data_sheet_expat_callback_find_cell_end);
  }
}